

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::anon_unknown_75::floatToChannel(deUint8 *dst,float src,ChannelType type)

{
  deUint8 dVar1;
  uchar uVar2;
  short sVar3;
  unsigned_short uVar4;
  deFloat16 dVar5;
  int iVar6;
  deUint32 dVar7;
  uint uVar8;
  ChannelType type_local;
  float src_local;
  deUint8 *dst_local;
  
  switch(type) {
  case SNORM_INT8:
    dVar1 = convertSatRte<signed_char>(src * 127.0);
    *dst = dVar1;
    break;
  case SNORM_INT16:
    sVar3 = convertSatRte<short>(src * 32767.0);
    *(short *)dst = sVar3;
    break;
  case SNORM_INT32:
    iVar6 = convertSatRte<int>(src * 2.1474836e+09);
    *(int *)dst = iVar6;
    break;
  case UNORM_INT8:
    uVar2 = convertSatRte<unsigned_char>(src * 255.0);
    *dst = uVar2;
    break;
  case UNORM_INT16:
    uVar4 = convertSatRte<unsigned_short>(src * 65535.0);
    *(unsigned_short *)dst = uVar4;
    break;
  case UNORM_INT24:
    dVar7 = convertSatRteUint24(src * 16777215.0);
    writeUint24(dst,dVar7);
    break;
  case UNORM_INT32:
    uVar8 = convertSatRte<unsigned_int>(src * 4.2949673e+09);
    *(uint *)dst = uVar8;
    break;
  default:
    break;
  case SIGNED_INT8:
    dVar1 = convertSatRte<signed_char>(src);
    *dst = dVar1;
    break;
  case SIGNED_INT16:
    sVar3 = convertSatRte<short>(src);
    *(short *)dst = sVar3;
    break;
  case SIGNED_INT32:
    iVar6 = convertSatRte<int>(src);
    *(int *)dst = iVar6;
    break;
  case UNSIGNED_INT8:
    uVar2 = convertSatRte<unsigned_char>(src);
    *dst = uVar2;
    break;
  case UNSIGNED_INT16:
    uVar4 = convertSatRte<unsigned_short>(src);
    *(unsigned_short *)dst = uVar4;
    break;
  case UNSIGNED_INT24:
    dVar7 = convertSatRteUint24(src);
    writeUint24(dst,dVar7);
    break;
  case UNSIGNED_INT32:
    uVar8 = convertSatRte<unsigned_int>(src);
    *(uint *)dst = uVar8;
    break;
  case HALF_FLOAT:
    dVar5 = deFloat32To16(src);
    *(deFloat16 *)dst = dVar5;
    break;
  case FLOAT:
    *(float *)dst = src;
    break;
  case FLOAT64:
    *(double *)dst = (double)src;
  }
  return;
}

Assistant:

void floatToChannel (deUint8* dst, float src, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			*((deInt8*)dst)			= convertSatRte<deInt8>		(src * 127.0f);			break;
		case TextureFormat::SNORM_INT16:		*((deInt16*)dst)		= convertSatRte<deInt16>	(src * 32767.0f);		break;
		case TextureFormat::SNORM_INT32:		*((deInt32*)dst)		= convertSatRte<deInt32>	(src * 2147483647.0f);	break;
		case TextureFormat::UNORM_INT8:			*((deUint8*)dst)		= convertSatRte<deUint8>	(src * 255.0f);			break;
		case TextureFormat::UNORM_INT16:		*((deUint16*)dst)		= convertSatRte<deUint16>	(src * 65535.0f);		break;
		case TextureFormat::UNORM_INT24:		writeUint24(dst,		  convertSatRteUint24		(src * 16777215.0f));	break;
		case TextureFormat::UNORM_INT32:		*((deUint32*)dst)		= convertSatRte<deUint32>	(src * 4294967295.0f);	break;
		case TextureFormat::SIGNED_INT8:		*((deInt8*)dst)			= convertSatRte<deInt8>		(src);					break;
		case TextureFormat::SIGNED_INT16:		*((deInt16*)dst)		= convertSatRte<deInt16>	(src);					break;
		case TextureFormat::SIGNED_INT32:		*((deInt32*)dst)		= convertSatRte<deInt32>	(src);					break;
		case TextureFormat::UNSIGNED_INT8:		*((deUint8*)dst)		= convertSatRte<deUint8>	(src);					break;
		case TextureFormat::UNSIGNED_INT16:		*((deUint16*)dst)		= convertSatRte<deUint16>	(src);					break;
		case TextureFormat::UNSIGNED_INT24:		writeUint24(dst,		  convertSatRteUint24		(src));					break;
		case TextureFormat::UNSIGNED_INT32:		*((deUint32*)dst)		= convertSatRte<deUint32>	(src);					break;
		case TextureFormat::HALF_FLOAT:			*((deFloat16*)dst)		= deFloat32To16				(src);					break;
		case TextureFormat::FLOAT:				*((float*)dst)			= src;												break;
		case TextureFormat::FLOAT64:			*((double*)dst)			= (double)src;										break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}